

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.cpp
# Opt level: O2

string * SHA256AutoDetect_abi_cxx11_
                   (string *__return_storage_ptr__,UseImplementation use_implementation)

{
  uint uVar1;
  uint uVar2;
  byte bVar3;
  ulong uVar4;
  uint *__first2;
  uchar *extraout_RDX;
  uchar *extraout_RDX_00;
  uchar *extraout_RDX_01;
  uchar *in;
  size_t i;
  long lVar5;
  undefined1 *__last1;
  long in_FS_OFFSET;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  uint in_XCR0;
  uint32_t state [8];
  uint local_138 [8];
  uchar local_118 [64];
  uchar local_d8 [128];
  uchar out [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"standard",(allocator<char> *)state);
  (anonymous_namespace)::Transform = anon_unknown.dwarf_4231437::sha256::Transform;
  (anonymous_namespace)::TransformD64_2way = (code *)0x0;
  (anonymous_namespace)::TransformD64 = anon_unknown.dwarf_4231437::sha256::TransformD64;
  (anonymous_namespace)::TransformD64_4way = (code *)0x0;
  (anonymous_namespace)::TransformD64_8way = (code *)0x0;
  lVar5 = cpuid_Version_info(1);
  uVar2 = *(uint *)(lVar5 + 0xc);
  uVar4 = (ulong)uVar2;
  bVar7 = (~uVar2 & 0x18000000) == 0;
  if (bVar7) {
    uVar4 = 0;
  }
  bVar6 = (uVar2 >> 0x13 & 1) == 0;
  bVar8 = (use_implementation & USE_SSE4) == STANDARD;
  __first2 = (uint *)CONCAT71((int7)(uVar4 >> 8),bVar8 || bVar6);
  if (!bVar8 && !bVar6) {
    lVar5 = cpuid_Extended_Feature_Enumeration_info(7);
    uVar1 = *(uint *)(lVar5 + 4);
    bVar3 = (byte)(uVar1 >> 0x1d) & 1 & use_implementation >> 2;
    __first2 = (uint *)(ulong)bVar3;
    if (bVar3 == 1) {
      (anonymous_namespace)::Transform = sha256_x86_shani::Transform;
      (anonymous_namespace)::TransformD64 =
           anon_unknown.dwarf_4231437::TransformD64Wrapper<&sha256_x86_shani::Transform>;
      (anonymous_namespace)::TransformD64_2way = sha256d64_x86_shani::Transform_2way;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                (__return_storage_ptr__,"x86_shani(1way,2way)");
    }
    else {
      (anonymous_namespace)::Transform = sha256_sse4::Transform;
      (anonymous_namespace)::TransformD64 =
           anon_unknown.dwarf_4231437::TransformD64Wrapper<&sha256_sse4::Transform>;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                (__return_storage_ptr__,"sse4(1way)");
      (anonymous_namespace)::TransformD64_4way = sha256d64_sse41::Transform_4way;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,",sse41(4way)");
      bVar6 = (uVar1 & 0x20) == 0;
      bVar8 = (use_implementation & USE_AVX2) == STANDARD;
      __first2 = (uint *)CONCAT71((int7)((ulong)__first2 >> 8),bVar8 || bVar6);
      if (((bVar7 && (~in_XCR0 & 6) == 0) && (uVar2 >> 0x1c & 1) != 0) && (!bVar8 && !bVar6)) {
        (anonymous_namespace)::TransformD64_8way = sha256d64_avx2::Transform_8way;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (__return_storage_ptr__,",avx2(8way)");
      }
    }
  }
  __last1 = (anonymous_namespace)::SelfTest()::result;
  lVar5 = 0;
  do {
    if (lVar5 == 9) {
      (*(code *)(anonymous_namespace)::TransformD64)
                (out,
                 "Lorem ipsum dolor sit amet, consectetur adipiscing elit, sed do eiusmod tempor incididunt ut labore et dolore magna aliqua. Et molestie ac feugiat sed lectus vestibulum mattis ullamcorper. Morbi blandit cursus risus at ultrices mi tempus imperdiet nulla. Nunc congue nisi vita suscipit tellus mauris. Imperdiet proin fermentum leo vel orci. Massa tempor nec feugiat nisl pretium fusce id velit. Telus in metus vulputate eu scelerisque felis. Mi tempus imperdiet nulla malesuada pellentesque. Tristique magna sit."
                );
      bVar7 = std::__equal<true>::equal<unsigned_char>
                        (out,(uchar *)&local_38,(anonymous_namespace)::SelfTest()::result_d64);
      if (!bVar7) break;
      in = extraout_RDX;
      if ((anonymous_namespace)::TransformD64_2way != (code *)0x0) {
        sha256d64_x86_shani::Transform_2way
                  ((uchar *)state,
                   "Lorem ipsum dolor sit amet, consectetur adipiscing elit, sed do eiusmod tempor incididunt ut labore et dolore magna aliqua. Et molestie ac feugiat sed lectus vestibulum mattis ullamcorper. Morbi blandit cursus risus at ultrices mi tempus imperdiet nulla. Nunc congue nisi vita suscipit tellus mauris. Imperdiet proin fermentum leo vel orci. Massa tempor nec feugiat nisl pretium fusce id velit. Telus in metus vulputate eu scelerisque felis. Mi tempus imperdiet nulla malesuada pellentesque. Tristique magna sit."
                  );
        bVar7 = std::__equal<true>::equal<unsigned_char>
                          ((uchar *)state,local_118,(anonymous_namespace)::SelfTest()::result_d64);
        in = extraout_RDX_00;
        if (!bVar7) break;
      }
      if ((anonymous_namespace)::TransformD64_4way != (code *)0x0) {
        sha256d64_sse41::Transform_4way
                  ((uchar *)state,
                   "Lorem ipsum dolor sit amet, consectetur adipiscing elit, sed do eiusmod tempor incididunt ut labore et dolore magna aliqua. Et molestie ac feugiat sed lectus vestibulum mattis ullamcorper. Morbi blandit cursus risus at ultrices mi tempus imperdiet nulla. Nunc congue nisi vita suscipit tellus mauris. Imperdiet proin fermentum leo vel orci. Massa tempor nec feugiat nisl pretium fusce id velit. Telus in metus vulputate eu scelerisque felis. Mi tempus imperdiet nulla malesuada pellentesque. Tristique magna sit."
                  );
        bVar7 = std::__equal<true>::equal<unsigned_char>
                          ((uchar *)state,local_d8,(anonymous_namespace)::SelfTest()::result_d64);
        in = extraout_RDX_01;
        if (!bVar7) break;
      }
      if ((anonymous_namespace)::TransformD64_8way != (code *)0x0) {
        sha256d64_avx2::Transform_8way
                  ((sha256d64_avx2 *)state,
                   "Lorem ipsum dolor sit amet, consectetur adipiscing elit, sed do eiusmod tempor incididunt ut labore et dolore magna aliqua. Et molestie ac feugiat sed lectus vestibulum mattis ullamcorper. Morbi blandit cursus risus at ultrices mi tempus imperdiet nulla. Nunc congue nisi vita suscipit tellus mauris. Imperdiet proin fermentum leo vel orci. Massa tempor nec feugiat nisl pretium fusce id velit. Telus in metus vulputate eu scelerisque felis. Mi tempus imperdiet nulla malesuada pellentesque. Tristique magna sit."
                   ,in);
        bVar7 = std::__equal<true>::equal<unsigned_char>
                          ((uchar *)state,out,(anonymous_namespace)::SelfTest()::result_d64);
        if (!bVar7) break;
      }
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return __return_storage_ptr__;
    }
    state[4] = 0x510e527f;
    state[5] = 0x9b05688c;
    state[6] = 0x1f83d9ab;
    state[7] = 0x5be0cd19;
    state[0] = 0x6a09e667;
    state[1] = 0xbb67ae85;
    state[2] = 0x3c6ef372;
    state[3] = 0xa54ff53a;
    (*(code *)(anonymous_namespace)::Transform)
              (state,
               "Lorem ipsum dolor sit amet, consectetur adipiscing elit, sed do eiusmod tempor incididunt ut labore et dolore magna aliqua. Et molestie ac feugiat sed lectus vestibulum mattis ullamcorper. Morbi blandit cursus risus at ultrices mi tempus imperdiet nulla. Nunc congue nisi vita suscipit tellus mauris. Imperdiet proin fermentum leo vel orci. Massa tempor nec feugiat nisl pretium fusce id velit. Telus in metus vulputate eu scelerisque felis. Mi tempus imperdiet nulla malesuada pellentesque. Tristique magna sit."
               ,lVar5);
    bVar7 = std::__equal<true>::equal<unsigned_int>
                      ((__equal<true> *)state,local_138,(uint *)__last1,__first2);
    lVar5 = lVar5 + 1;
    __last1 = (undefined1 *)((long)__last1 + 0x20);
  } while (bVar7);
  __assert_fail("SelfTest()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/crypto/sha256.cpp"
                ,0x2b2,"std::string SHA256AutoDetect(sha256_implementation::UseImplementation)");
}

Assistant:

std::string SHA256AutoDetect(sha256_implementation::UseImplementation use_implementation)
{
    std::string ret = "standard";
    Transform = sha256::Transform;
    TransformD64 = sha256::TransformD64;
    TransformD64_2way = nullptr;
    TransformD64_4way = nullptr;
    TransformD64_8way = nullptr;

#if !defined(DISABLE_OPTIMIZED_SHA256)
#if defined(HAVE_GETCPUID)
    bool have_sse4 = false;
    bool have_xsave = false;
    bool have_avx = false;
    [[maybe_unused]] bool have_avx2 = false;
    [[maybe_unused]] bool have_x86_shani = false;
    [[maybe_unused]] bool enabled_avx = false;

    uint32_t eax, ebx, ecx, edx;
    GetCPUID(1, 0, eax, ebx, ecx, edx);
    if (use_implementation & sha256_implementation::USE_SSE4) {
        have_sse4 = (ecx >> 19) & 1;
    }
    have_xsave = (ecx >> 27) & 1;
    have_avx = (ecx >> 28) & 1;
    if (have_xsave && have_avx) {
        enabled_avx = AVXEnabled();
    }
    if (have_sse4) {
        GetCPUID(7, 0, eax, ebx, ecx, edx);
        if (use_implementation & sha256_implementation::USE_AVX2) {
            have_avx2 = (ebx >> 5) & 1;
        }
        if (use_implementation & sha256_implementation::USE_SHANI) {
            have_x86_shani = (ebx >> 29) & 1;
        }
    }

#if defined(ENABLE_SSE41) && defined(ENABLE_X86_SHANI)
    if (have_x86_shani) {
        Transform = sha256_x86_shani::Transform;
        TransformD64 = TransformD64Wrapper<sha256_x86_shani::Transform>;
        TransformD64_2way = sha256d64_x86_shani::Transform_2way;
        ret = "x86_shani(1way,2way)";
        have_sse4 = false; // Disable SSE4/AVX2;
        have_avx2 = false;
    }
#endif

    if (have_sse4) {
#if defined(__x86_64__) || defined(__amd64__)
        Transform = sha256_sse4::Transform;
        TransformD64 = TransformD64Wrapper<sha256_sse4::Transform>;
        ret = "sse4(1way)";
#endif
#if defined(ENABLE_SSE41)
        TransformD64_4way = sha256d64_sse41::Transform_4way;
        ret += ",sse41(4way)";
#endif
    }

#if defined(ENABLE_AVX2)
    if (have_avx2 && have_avx && enabled_avx) {
        TransformD64_8way = sha256d64_avx2::Transform_8way;
        ret += ",avx2(8way)";
    }
#endif
#endif // defined(HAVE_GETCPUID)

#if defined(ENABLE_ARM_SHANI)
    bool have_arm_shani = false;
    if (use_implementation & sha256_implementation::USE_SHANI) {
#if defined(__linux__)
#if defined(__arm__) // 32-bit
        if (getauxval(AT_HWCAP2) & HWCAP2_SHA2) {
            have_arm_shani = true;
        }
#endif
#if defined(__aarch64__) // 64-bit
        if (getauxval(AT_HWCAP) & HWCAP_SHA2) {
            have_arm_shani = true;
        }
#endif
#endif

#if defined(__APPLE__)
        int val = 0;
        size_t len = sizeof(val);
        if (sysctlbyname("hw.optional.arm.FEAT_SHA256", &val, &len, nullptr, 0) == 0) {
            have_arm_shani = val != 0;
        }
#endif
    }

    if (have_arm_shani) {
        Transform = sha256_arm_shani::Transform;
        TransformD64 = TransformD64Wrapper<sha256_arm_shani::Transform>;
        TransformD64_2way = sha256d64_arm_shani::Transform_2way;
        ret = "arm_shani(1way,2way)";
    }
#endif
#endif // DISABLE_OPTIMIZED_SHA256

    assert(SelfTest());
    return ret;
}